

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall phosg::Image::set_has_alpha(Image *this,bool new_has_alpha)

{
  bool bVar1;
  uint8_t uVar2;
  void *__ptr;
  uint64_t uVar3;
  size_t __size;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  if (this->has_alpha != new_has_alpha) {
    this->has_alpha = new_has_alpha;
    __size = get_data_size(this);
    pvVar4 = malloc(__size);
    lVar6 = this->height * this->width;
    bVar1 = this->has_alpha;
    uVar2 = this->channel_width;
    __ptr = (this->data).raw;
    uVar3 = this->max_value;
    lVar5 = 0;
    if (0 < lVar6) {
      lVar5 = lVar6;
    }
    lVar6 = 2;
    lVar7 = 3;
    while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
      switch(uVar2 << 5 | (byte)(uVar2 - 8) >> 3) {
      case 0:
        *(undefined1 *)((long)pvVar4 + lVar7 + -3) = *(undefined1 *)((long)__ptr + lVar6 + -2);
        *(undefined1 *)((long)pvVar4 + lVar7 + -2) = *(undefined1 *)((long)__ptr + lVar6 + -1);
        *(undefined1 *)((long)pvVar4 + lVar7 + -1) = *(undefined1 *)((long)__ptr + lVar6);
        if ((bVar1 & 1U) != 0) {
          *(char *)((long)pvVar4 + lVar7) = (char)uVar3;
        }
        break;
      case 1:
        *(undefined2 *)((long)pvVar4 + lVar7 * 2 + -6) =
             *(undefined2 *)((long)__ptr + lVar6 * 2 + -4);
        *(undefined2 *)((long)pvVar4 + lVar7 * 2 + -4) =
             *(undefined2 *)((long)__ptr + lVar6 * 2 + -2);
        *(undefined2 *)((long)pvVar4 + lVar7 * 2 + -2) = *(undefined2 *)((long)__ptr + lVar6 * 2);
        if ((bVar1 & 1U) != 0) {
          *(short *)((long)pvVar4 + lVar7 * 2) = (short)uVar3;
        }
        break;
      case 3:
        *(undefined4 *)((long)pvVar4 + lVar7 * 4 + -0xc) =
             *(undefined4 *)((long)__ptr + lVar6 * 4 + -8);
        *(undefined4 *)((long)pvVar4 + lVar7 * 4 + -8) =
             *(undefined4 *)((long)__ptr + lVar6 * 4 + -4);
        *(undefined4 *)((long)pvVar4 + lVar7 * 4 + -4) = *(undefined4 *)((long)__ptr + lVar6 * 4);
        if ((bVar1 & 1U) != 0) {
          *(int *)((long)pvVar4 + lVar7 * 4) = (int)uVar3;
        }
        break;
      case 7:
        *(undefined8 *)((long)pvVar4 + lVar7 * 8 + -0x18) =
             *(undefined8 *)((long)__ptr + lVar6 * 8 + -0x10);
        *(undefined8 *)((long)pvVar4 + lVar7 * 8 + -0x10) =
             *(undefined8 *)((long)__ptr + lVar6 * 8 + -8);
        *(undefined8 *)((long)pvVar4 + lVar7 * 8 + -8) = *(undefined8 *)((long)__ptr + lVar6 * 8);
        if ((bVar1 & 1U) != 0) {
          *(uint64_t *)((long)pvVar4 + lVar7 * 8) = uVar3;
        }
      }
      lVar6 = lVar6 + (4 - (ulong)(bVar1 & 1));
      lVar7 = lVar7 + (ulong)(bVar1 & 1) + 3;
    }
    free(__ptr);
    (this->data).raw = pvVar4;
  }
  return;
}

Assistant:

void Image::set_has_alpha(bool new_has_alpha) {
  if (this->has_alpha == new_has_alpha) {
    return;
  }
  this->has_alpha = new_has_alpha;

  DataPtrs new_data;
  new_data.raw = malloc(this->get_data_size());

  for (ssize_t z = 0; z < this->width * this->height; z++) {
    size_t src_index = z * (this->has_alpha ? 3 : 4);
    size_t dst_index = z * (this->has_alpha ? 4 : 3);

    if (this->channel_width == 8) {
      new_data.as8[dst_index + 0] = this->data.as8[src_index + 0];
      new_data.as8[dst_index + 1] = this->data.as8[src_index + 1];
      new_data.as8[dst_index + 2] = this->data.as8[src_index + 2];
      if (this->has_alpha) {
        new_data.as8[dst_index + 3] = this->max_value;
      }
    } else if (this->channel_width == 16) {
      new_data.as16[dst_index + 0] = this->data.as16[src_index + 0];
      new_data.as16[dst_index + 1] = this->data.as16[src_index + 1];
      new_data.as16[dst_index + 2] = this->data.as16[src_index + 2];
      if (this->has_alpha) {
        new_data.as16[dst_index + 3] = this->max_value;
      }
    } else if (this->channel_width == 32) {
      new_data.as32[dst_index + 0] = this->data.as32[src_index + 0];
      new_data.as32[dst_index + 1] = this->data.as32[src_index + 1];
      new_data.as32[dst_index + 2] = this->data.as32[src_index + 2];
      if (this->has_alpha) {
        new_data.as32[dst_index + 3] = this->max_value;
      }
    } else if (this->channel_width == 64) {
      new_data.as64[dst_index + 0] = this->data.as64[src_index + 0];
      new_data.as64[dst_index + 1] = this->data.as64[src_index + 1];
      new_data.as64[dst_index + 2] = this->data.as64[src_index + 2];
      if (this->has_alpha) {
        new_data.as64[dst_index + 3] = this->max_value;
      }
    }
  }

  free(this->data.raw);
  this->data.raw = new_data.raw;
}